

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::CFIReaderImpl::parseElement(CFIReaderImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  size_type sVar3;
  pointer pcVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  string *psVar7;
  byte *pbVar8;
  QName *pQVar9;
  long *plVar10;
  byte *pbVar11;
  runtime_error *this_00;
  DeadlyImportError *this_01;
  byte *pbVar12;
  ulong *puVar13;
  long lVar14;
  _func_int **pp_Var15;
  byte bVar16;
  value_type *__x;
  Attribute attr;
  __string_type __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [32];
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  value_type *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_> *local_80;
  undefined1 local_78 [40];
  pointer local_50;
  pointer local_48;
  
  local_78._32_8_ = &this->attributes;
  std::vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
  _M_erase_at_end((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                   *)local_78._32_8_,
                  (this->attributes).
                  super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  pbVar11 = this->dataP;
  local_90 = (value_type *)CONCAT44(local_90._4_4_,(uint)*pbVar11);
  if ((*pbVar11 & 0x3f) == 0x38) {
    pbVar8 = pbVar11 + 1;
    this->dataP = pbVar8;
    pbVar12 = this->dataEnd;
    if (pbVar12 == pbVar8 || (long)pbVar12 - (long)pbVar8 < 0) {
LAB_0063af0e:
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_0063af48;
    }
    this->dataP = pbVar11 + 2;
    bVar16 = pbVar11[1];
    if (bVar16 != 0xf0) {
      local_80 = (vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
                  *)&(this->vocabulary).prefixTable;
      paVar1 = &local_140.field_2;
      local_88 = &(this->vocabulary).namespaceNameTable;
      do {
        if ((bVar16 & 0xfc) != 0xcc) {
          this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
          goto LAB_0063af48;
        }
        local_120._8_8_ = 0;
        local_120._16_8_ = local_120._16_8_ & 0xffffffffffffff00;
        local_100._M_p = (pointer)&local_f0;
        local_f8 = 0;
        local_f0._M_local_buf[0] = '\0';
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        local_e0._M_string_length = 0;
        local_e0.field_2._M_local_buf[0] = '\0';
        local_c0._M_p = (pointer)&local_b0;
        local_b8 = 0;
        local_b0._M_local_buf[0] = '\0';
        local_a0 = (element_type *)0x0;
        _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_120._0_8_ = local_120 + 0x10;
        std::__cxx11::string::_M_replace((ulong)local_120,0,(char *)0x0,0x7b1dfd);
        if ((bVar16 & 2) == 0) {
          local_140._M_string_length = 0;
          local_140.field_2._M_local_buf[0] = '\0';
          local_140._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          psVar7 = parseIdentifyingStringOrIndex
                             (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_80);
          pcVar4 = (psVar7->_M_dataplus)._M_p;
          local_140._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar4,pcVar4 + psVar7->_M_string_length);
        }
        std::__cxx11::string::_M_assign((string *)&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((bVar16 & 1) == 0) {
          local_140._M_string_length = 0;
          local_140.field_2._M_local_buf[0] = '\0';
          local_140._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          psVar7 = parseIdentifyingStringOrIndex(this,local_88);
          pcVar4 = (psVar7->_M_dataplus)._M_p;
          local_140._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar4,pcVar4 + psVar7->_M_string_length);
        }
        std::__cxx11::string::_M_assign((string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if (local_e0._M_string_length == 0) {
          local_140._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"xmlns","");
        }
        else {
          std::operator+(&local_140,"xmlns:",&local_e0);
        }
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        local_140._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_100._M_p,local_100._M_p + local_f8);
        FIStringValue::create((FIStringValue *)local_78,&local_140);
        uVar5 = local_78._8_8_;
        local_a0 = (element_type *)local_78._0_8_;
        _Var6._M_pi = _Stack_98._M_pi;
        local_78._0_8_ = (_func_int **)0x0;
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        std::
        vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
        ::push_back((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                     *)local_78._32_8_,(value_type *)local_120);
        if (_Stack_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_98._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_p != &local_b0) {
          operator_delete(local_c0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_p != &local_f0) {
          operator_delete(local_100._M_p);
        }
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_);
        }
        pbVar8 = this->dataP;
        pbVar12 = this->dataEnd;
        if ((long)pbVar12 - (long)pbVar8 < 1) goto LAB_0063af0e;
        this->dataP = pbVar8 + 1;
        bVar16 = *pbVar8;
      } while (bVar16 != 0xf0);
    }
    if (((long)pbVar12 - (long)(pbVar8 + 1) < 1) || (0x3f < pbVar8[1])) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_0063af48;
    }
  }
  pQVar9 = parseQualifiedNameOrIndex3(this,&(this->vocabulary).elementNameTable);
  sVar3 = (pQVar9->prefix)._M_string_length;
  if (sVar3 == 0) {
    local_120._0_8_ = local_120 + 0x10;
    pcVar4 = (pQVar9->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_120,pcVar4,pcVar4 + (pQVar9->name)._M_string_length);
  }
  else {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    pcVar4 = (pQVar9->prefix)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_140,pcVar4,pcVar4 + sVar3);
    std::__cxx11::string::_M_replace_aux((ulong)&local_140,local_140._M_string_length,0,'\x01');
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_140,(ulong)(pQVar9->name)._M_dataplus._M_p);
    local_120._0_8_ = local_120 + 0x10;
    puVar13 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar13) {
      local_120._16_8_ = *puVar13;
      local_120._24_8_ = plVar10[3];
    }
    else {
      local_120._16_8_ = *puVar13;
      local_120._0_8_ = (ulong *)*plVar10;
    }
    local_120._8_8_ = plVar10[1];
    *plVar10 = (long)puVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
  }
  __x = &this->nodeName;
  std::__cxx11::string::_M_assign((string *)__x);
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_);
  }
  if ((sVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2)) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  pbVar11 = this->dataP;
  lVar14 = (long)this->dataEnd - (long)pbVar11;
  if (((ulong)local_90 & 0x40) != 0) {
    local_90 = __x;
    if (0 < lVar14) {
      local_80 = &(this->vocabulary).attributeNameTable;
      pp_Var2 = (_func_int **)(local_78 + 0x10);
      local_88 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&(this->vocabulary).attributeValueTable;
      do {
        bVar16 = *pbVar11;
        if ((char)bVar16 < '\0') {
          if (0xef < bVar16) {
            this->emptyElement = bVar16 == 0xff;
            this->dataP = pbVar11 + 1;
            __x = local_90;
            goto LAB_0063aea4;
          }
          this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
          goto LAB_0063af48;
        }
        local_120._0_8_ = local_120 + 0x10;
        local_120._8_8_ = 0;
        local_120._16_8_ = local_120._16_8_ & 0xffffffffffffff00;
        local_f8 = 0;
        local_f0._M_local_buf[0] = '\0';
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        local_e0._M_string_length = 0;
        local_e0.field_2._M_local_buf[0] = '\0';
        local_c0._M_p = (pointer)&local_b0;
        local_b8 = 0;
        local_b0._M_local_buf[0] = '\0';
        local_a0 = (element_type *)0x0;
        _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_100._M_p = (pointer)&local_f0;
        parseQualifiedNameOrIndex2(this,local_80);
        std::__cxx11::string::_M_assign((string *)local_120);
        std::__cxx11::string::_M_assign((string *)&local_100);
        std::__cxx11::string::_M_assign((string *)&local_e0);
        uVar5 = local_120._8_8_;
        if (local_120._8_8_ == 0) {
          local_78._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_e0._M_dataplus._M_p,
                     local_e0._M_dataplus._M_p + local_e0._M_string_length);
        }
        else {
          local_50 = (pointer)&stack0xffffffffffffffc0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_120._0_8_,
                     (pointer)(local_120._0_8_ + local_120._8_8_));
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,(ulong)local_48,0,'\x01');
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_50,(ulong)local_e0._M_dataplus._M_p);
          pp_Var15 = (_func_int **)(plVar10 + 2);
          if ((_func_int **)*plVar10 == pp_Var15) {
            local_78._16_8_ = *pp_Var15;
            local_78._24_8_ = plVar10[3];
            local_78._0_8_ = pp_Var2;
          }
          else {
            local_78._16_8_ = *pp_Var15;
            local_78._0_8_ = (_func_int **)*plVar10;
          }
          local_78._8_8_ = plVar10[1];
          *plVar10 = (long)pp_Var15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
        }
        std::__cxx11::string::operator=((string *)&local_c0,(string *)local_78);
        if ((_func_int **)local_78._0_8_ != pp_Var2) {
          operator_delete((void *)local_78._0_8_);
        }
        if ((uVar5 != 0) && (local_50 != (pointer)&stack0xffffffffffffffc0)) {
          operator_delete(local_50);
        }
        if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,(string *)&parseErrorMessage_abi_cxx11_);
          *(undefined ***)this_00 = &PTR__runtime_error_00900168;
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        parseNonIdentifyingStringOrIndex1
                  ((CFIReaderImpl *)local_78,
                   (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                    *)this);
        uVar5 = local_78._8_8_;
        local_a0 = (element_type *)local_78._0_8_;
        _Var6._M_pi = _Stack_98._M_pi;
        local_78._0_8_ = (_func_int **)0x0;
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        }
        std::
        vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
        ::push_back((vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                     *)local_78._32_8_,(value_type *)local_120);
        if (_Stack_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_98._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_p != &local_b0) {
          operator_delete(local_c0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_p != &local_f0) {
          operator_delete(local_100._M_p);
        }
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_);
        }
        pbVar11 = this->dataP;
      } while (0 < (long)this->dataEnd - (long)pbVar11);
    }
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
LAB_0063af48:
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (lVar14 < 1) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_01,(string *)&parseErrorMessage_abi_cxx11_);
    goto LAB_0063af48;
  }
  if (*pbVar11 != 0xf0) {
    if (*pbVar11 != 0xff) {
      this->emptyElement = false;
      goto LAB_0063aea4;
    }
    this->terminatorPending = true;
  }
  this->emptyElement = true;
  this->dataP = pbVar11 + 1;
LAB_0063aea4:
  if (this->emptyElement == false) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->elementStack).c,__x);
  }
  this->currentNodeType = EXN_ELEMENT;
  return;
}

Assistant:

void parseElement() {
        // C.3

        attributes.clear();

        uint8_t b = *dataP;
        bool hasAttributes = (b & 0x40) != 0; // C.3.3
        if ((b & 0x3f) == 0x38) { // C.3.4.1
            // Parse namespaces
            ++dataP;
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP++;
                if (b == 0xf0) { // C.3.4.3
                    break;
                }
                if ((b & 0xfc) != 0xcc) { // C.3.4.2
                    throw DeadlyImportError(parseErrorMessage);
                }
                // C.12
                Attribute attr;
                attr.qname.prefix = "xmlns";
                attr.qname.name = b & 0x02 ? parseIdentifyingStringOrIndex(vocabulary.prefixTable) : std::string();
                attr.qname.uri = b & 0x01 ? parseIdentifyingStringOrIndex(vocabulary.namespaceNameTable) : std::string();
                attr.name = attr.qname.name.empty() ? "xmlns" : "xmlns:" + attr.qname.name;
                attr.value = FIStringValue::create(std::string(attr.qname.uri));
                attributes.push_back(attr);
            }
            if ((dataEnd - dataP < 1) || (*dataP & 0xc0)) {
                throw DeadlyImportError(parseErrorMessage);
            }
        }

        // Parse Element name (C.3.5)
        const QName &elemName = parseQualifiedNameOrIndex3(vocabulary.elementNameTable);
        nodeName = elemName.prefix.empty() ? elemName.name : elemName.prefix + ':' + elemName.name;

        if (hasAttributes) {
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP;
                if (b < 0x80) { // C.3.6.1
                    // C.4
                    Attribute attr;
                    attr.qname = parseQualifiedNameOrIndex2(vocabulary.attributeNameTable);
                    attr.name = attr.qname.prefix.empty() ? attr.qname.name : attr.qname.prefix + ':' + attr.qname.name;
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    attr.value = parseNonIdentifyingStringOrIndex1(vocabulary.attributeValueTable);
                    attributes.push_back(attr);
                }
                else {
                    if ((b & 0xf0) != 0xf0) { // C.3.6.2
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    emptyElement = b == 0xff; // C.3.6.2, C.3.8
                    ++dataP;
                    break;
                }
            }
        }
        else {
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            b = *dataP;
            switch (b) {
            case 0xff:
                terminatorPending = true;
                // Intentionally fall through
            case 0xf0:
                emptyElement = true;
                ++dataP;
                break;
            default:
                emptyElement = false;
            }
        }
        if (!emptyElement) {
            elementStack.push(nodeName);
        }

        currentNodeType = irr::io::EXN_ELEMENT;
    }